

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* load(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       *__return_storage_ptr__,istream *in,int col_offset)

{
  pointer *ppvVar1;
  iterator __position;
  pointer pvVar2;
  iterator __position_00;
  double dVar3;
  char *__nptr;
  char cVar4;
  istream *piVar5;
  int *piVar6;
  undefined8 uVar7;
  int iVar8;
  string token;
  string line;
  istringstream lin;
  char *local_210;
  undefined8 local_208;
  char local_200 [16];
  istream *local_1f0;
  pointer local_1e8;
  double local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = '\0';
  local_1f0 = in;
  do {
    do {
      cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in,(string *)&local_1d0,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        return __return_storage_ptr__;
      }
    } while (*local_1d0 == '%');
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_realloc_insert<>(__return_storage_ptr__,__position);
    }
    else {
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppvVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppvVar1 = *ppvVar1 + 1;
    }
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    local_1e8 = pvVar2 + -1;
    local_210 = local_200;
    local_208 = 0;
    local_200[0] = '\0';
    iVar8 = col_offset;
    if (0 < col_offset) {
      do {
        std::operator>>((istream *)local_1b0,(string *)&local_210);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    while (piVar5 = std::operator>>((istream *)local_1b0,(string *)&local_210), __nptr = local_210,
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      piVar6 = __errno_location();
      iVar8 = *piVar6;
      *piVar6 = 0;
      dVar3 = strtod(__nptr,&local_1d8);
      if (local_1d8 == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_00103c9d:
        uVar7 = std::__throw_out_of_range("stod");
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(__return_storage_ptr__);
        _Unwind_Resume(uVar7);
      }
      if (*piVar6 == 0) {
        *piVar6 = iVar8;
      }
      else if (*piVar6 == 0x22) goto LAB_00103c9d;
      __position_00._M_current =
           pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_1e0 = dVar3;
      if (__position_00._M_current ==
          pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_1e8,__position_00,&local_1e0);
      }
      else {
        *__position_00._M_current = dVar3;
        pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
    }
    if (local_210 != local_200) {
      operator_delete(local_210);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    in = local_1f0;
  } while( true );
}

Assistant:

std::vector<Container> load(std::istream& in, int col_offset)
{
    std::vector<Container> points;
    std::string line;
    while (std::getline(in, line))
    {
        if (line[0] == '%')
            continue;
        points.emplace_back();
        auto& point = points.back();
        std::istringstream lin(line);
        std::string token;
        for (int i = 0; i < col_offset; i++)
            lin >> token;
        while (lin >> token)
            point.push_back(std::stod(token));
    }
    return points;
}